

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_database.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_59778::OpenCorruptStore::check_database_open
          (OpenCorruptStore *this,error_code err)

{
  bool bVar1;
  pointer *__ptr;
  AssertHelper aAStack_198 [2];
  AssertionResult gtest_ar;
  char *local_160;
  undefined8 local_158;
  char local_150 [16];
  database local_140;
  
  pstore::get_error_category();
  local_160 = local_150;
  local_150[0] = '\0';
  local_150[1] = '\0';
  local_150[2] = '\0';
  local_150[3] = '\0';
  local_150[4] = '\0';
  local_150[5] = '\0';
  local_150[6] = '\0';
  local_150[7] = '\0';
  local_150[8] = '\0';
  local_150[9] = '\0';
  local_150[10] = '\0';
  local_150[0xb] = '\0';
  local_150[0xc] = '\0';
  local_150[0xd] = '\0';
  local_150[0xe] = '\0';
  local_150[0xf] = '\0';
  local_158 = 0;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    pstore::database::database<pstore::file::in_memory>(&local_140,&(this->store_).file_,true);
    pstore::database::~database(&local_140);
  }
  std::__cxx11::string::assign((char *)&local_160);
  testing::Message::Message((Message *)&gtest_ar);
  testing::internal::AssertHelper::AssertHelper
            (aAStack_198,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/common/check_for_error.hpp"
             ,0x28,local_160);
  testing::internal::AssertHelper::operator=(aAStack_198,(Message *)&gtest_ar);
  testing::internal::AssertHelper::~AssertHelper(aAStack_198);
  if (gtest_ar._0_8_ != 0) {
    (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
  }
  std::__cxx11::string::~string((string *)&local_160);
  return;
}

Assistant:

void OpenCorruptStore::check_database_open (pstore::error_code err) const {
        check_for_error ([this] () { pstore::database{store_.file ()}; }, err);
    }